

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  _func_void_j_decompress_ptr *p_Var4;
  JSAMPARRAY ppJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  JSAMPROW pJVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  byte *pbVar30;
  ulong uVar31;
  long *plVar32;
  ulong uVar33;
  ulong uVar34;
  byte *pbVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  bool bVar40;
  JSAMPLE colorlist [256];
  INT32 mindist [256];
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  p_Var4 = cinfo->cquantize[1].finish_pass;
  uVar11 = c0 * 8;
  uVar26 = (long)(int)uVar11 & 0xffffffffffffffe0U | 4;
  uVar12 = c1 * 4;
  uVar28 = (long)(int)uVar12 & 0xffffffffffffffe0U | 2;
  uVar13 = c2 * 8;
  uVar24 = (long)(int)uVar13 & 0xffffffffffffffe0;
  lVar16 = uVar24 + 4;
  lVar20 = (long)cinfo->actual_number_of_colors;
  iVar25 = (int)uVar26;
  iVar27 = (int)uVar28;
  uVar29 = (uint)lVar16;
  if (lVar20 < 1) {
    uVar11 = 0;
  }
  else {
    uVar37 = (long)(int)uVar11 | 0x1c;
    uVar9 = (uint)uVar37;
    uVar39 = (long)(int)uVar12 | 0x1e;
    iVar21 = (int)uVar39;
    uVar33 = (long)(int)uVar13 | 0x1c;
    iVar19 = (int)uVar33;
    ppJVar5 = cinfo->colormap;
    pJVar6 = *ppJVar5;
    pJVar7 = ppJVar5[1];
    pJVar8 = ppJVar5[2];
    lVar22 = 0;
    lVar18 = 0x7fffffff;
    do {
      bVar1 = pJVar6[lVar22];
      uVar31 = (ulong)bVar1;
      if ((int)(uint)bVar1 < iVar25) {
        lVar14 = (uVar31 - uVar26) * 2;
        lVar14 = lVar14 * lVar14;
        uVar15 = uVar9;
      }
      else if ((int)uVar9 < (int)(uint)bVar1) {
        lVar14 = (uVar31 - uVar37) * 2;
        lVar14 = lVar14 * lVar14;
        uVar15 = uVar11 & 0xffffffe0 | 4;
      }
      else {
        uVar15 = uVar11 & 0xffffffe0 | 4;
        if ((uint)bVar1 <= iVar25 + uVar9 >> 1) {
          uVar15 = uVar9;
        }
        lVar14 = 0;
      }
      bVar1 = pJVar7[lVar22];
      uVar17 = (ulong)bVar1;
      if ((int)(uint)bVar1 < iVar27) {
        lVar38 = (uVar17 - uVar28) * 3;
        lVar14 = lVar14 + lVar38 * lVar38;
LAB_0010c0da:
        uVar23 = uVar12 | 0x1e;
      }
      else if (iVar21 < (int)(uint)bVar1) {
        lVar38 = (uVar17 - uVar39) * 3;
        lVar14 = lVar14 + lVar38 * lVar38;
        uVar23 = uVar12 & 0xffffffe0 | 2;
      }
      else {
        uVar23 = uVar12 & 0xffffffe0 | 2;
        if ((uint)bVar1 <= (uint)(iVar27 + iVar21) >> 1) goto LAB_0010c0da;
      }
      bVar1 = pJVar8[lVar22];
      uVar34 = (ulong)bVar1;
      if ((int)(uint)bVar1 < (int)uVar29) {
        lVar38 = uVar34 - lVar16;
        lVar14 = lVar14 + lVar38 * lVar38;
LAB_0010c11f:
        uVar36 = uVar13 | 0x1c;
      }
      else {
        uVar36 = uVar29;
        if (iVar19 < (int)(uint)bVar1) {
          lVar38 = uVar34 - uVar33;
          lVar14 = lVar14 + lVar38 * lVar38;
        }
        else if ((uint)bVar1 <= uVar29 + iVar19 >> 1) goto LAB_0010c11f;
      }
      lVar38 = (uVar31 - (long)(int)uVar15) * 2;
      lVar10 = (uVar17 - (long)(int)uVar23) * 3;
      lVar38 = (uVar34 - (long)(int)uVar36) * (uVar34 - (long)(int)uVar36) +
               lVar10 * lVar10 + lVar38 * lVar38;
      local_838[lVar22] = lVar14;
      if (lVar18 <= lVar38) {
        lVar38 = lVar18;
      }
      lVar22 = lVar22 + 1;
      lVar18 = lVar38;
    } while (lVar20 != lVar22);
    lVar16 = 0;
    uVar11 = 0;
    do {
      if (local_838[lVar16] <= lVar38) {
        lVar18 = (long)(int)uVar11;
        uVar11 = uVar11 + 1;
        abStack_938[lVar18] = (byte)lVar16;
      }
      lVar16 = lVar16 + 1;
    } while (lVar20 != lVar16);
  }
  lVar16 = 0;
  do {
    local_838[lVar16] = 0x7fffffff;
    local_838[lVar16 + 1] = 0x7fffffff;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x80);
  if (0 < (int)uVar11) {
    uVar26 = 0;
    do {
      bVar1 = abStack_938[uVar26];
      ppJVar5 = cinfo->colormap;
      lVar20 = ((long)iVar25 - (ulong)(*ppJVar5)[bVar1]) * 2;
      bVar2 = ppJVar5[1][bVar1];
      lVar16 = ((long)iVar27 - (ulong)bVar2) * 3;
      bVar3 = ppJVar5[2][bVar1];
      lVar18 = (long)(int)uVar29 - (ulong)bVar3;
      lVar16 = lVar18 * lVar18 + lVar16 * lVar16 + lVar20 * lVar20;
      lVar20 = ((long)iVar25 - (ulong)(*ppJVar5)[bVar1]) * 0x40 + 0x100;
      iVar21 = 3;
      pbVar35 = local_9b8;
      plVar32 = local_838;
      do {
        iVar19 = 7;
        lVar18 = lVar16;
        lVar22 = ((long)iVar27 - (ulong)bVar2) * 0x48 + 0x90;
        do {
          lVar38 = 0;
          lVar14 = lVar18;
          do {
            if (lVar14 < *plVar32) {
              *plVar32 = lVar14;
              *pbVar35 = bVar1;
            }
            lVar14 = lVar14 + (long)(int)uVar24 * 0x10 + 0x80 + (ulong)bVar3 * -0x10 + lVar38;
            plVar32 = plVar32 + 1;
            pbVar35 = pbVar35 + 1;
            lVar38 = lVar38 + 0x80;
          } while ((int)lVar38 != 0x200);
          lVar18 = lVar18 + lVar22;
          lVar22 = lVar22 + 0x120;
          bVar40 = iVar19 != 0;
          iVar19 = iVar19 + -1;
        } while (bVar40);
        lVar16 = lVar16 + lVar20;
        lVar20 = lVar20 + 0x200;
        bVar40 = iVar21 != 0;
        iVar21 = iVar21 + -1;
      } while (bVar40);
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar11);
  }
  pbVar35 = local_9b8;
  uVar24 = 0;
  do {
    lVar16 = *(long *)(p_Var4 + (uVar24 | (long)(int)(c0 & 0xfffffffc)) * 8) +
             (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
    lVar20 = 0;
    do {
      pbVar30 = pbVar35;
      lVar18 = 0;
      do {
        *(ushort *)(lVar16 + lVar18 * 2) = pbVar30[lVar18] + 1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      lVar20 = lVar20 + 1;
      lVar16 = lVar16 + 0x40;
      pbVar35 = pbVar30 + 4;
    } while (lVar20 != 8);
    uVar24 = uVar24 + 1;
    pbVar35 = pbVar30 + 4;
  } while (uVar24 != 4);
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap (j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;	/* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE * cptr;	/* pointer into bestcolor[] array */
  register histptr cachep;	/* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;		/* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);
  
  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
		   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = & histogram[c0+ic0][c1+ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
	*cachep++ = (histcell) (GETJSAMPLE(*cptr++) + 1);
      }
    }
  }
}